

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.cpp
# Opt level: O0

string * __thiscall verilogAST::File::toString_abi_cxx11_(string *__return_storage_ptr__,File *this)

{
  bool bVar1;
  pointer pAVar2;
  allocator<char> local_e1;
  string local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  value_type local_a8;
  reference local_88;
  unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_> *module;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_strs;
  allocator<char> local_39;
  string local_38 [8];
  string file_str;
  File *this_local;
  
  file_str.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  __end1 = std::
           vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
           ::begin(&this->modules);
  module = (unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>
            *)std::
              vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
              ::end(&this->modules);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_*,_std::vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>_>
                                *)&module);
    if (!bVar1) break;
    local_88 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_*,_std::vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>_>
               ::operator*(&__end1);
    pAVar2 = std::
             unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>
             ::operator->(local_88);
    (*(code *)**(undefined8 **)pAVar2)(&local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_*,_std::vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"\n",&local_e1);
  join(__return_storage_ptr__,&local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string File::toString() {
  std::string file_str = "";

  std::vector<std::string> file_strs;
  for (auto &module : modules) {
    file_strs.push_back(module->toString());
  }

  return join(file_strs, "\n");
}